

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiColumnText(Fts5Context *pCtx,int iCol,char **pz,int *pn)

{
  int iVar1;
  uchar *puVar2;
  Fts5Cursor *pCsr;
  int rc;
  int *pn_local;
  char **pz_local;
  int iCol_local;
  Fts5Context *pCtx_local;
  
  pCsr._4_4_ = 0;
  iVar1 = fts5IsContentless(*(Fts5FullTable **)pCtx);
  if ((iVar1 == 0) && (*(int *)(pCtx + 0x20) != 3)) {
    pCsr._4_4_ = fts5SeekCursor((Fts5Cursor *)pCtx,0);
    if (pCsr._4_4_ == 0) {
      puVar2 = sqlite3_column_text(*(sqlite3_stmt **)(pCtx + 0x38),iCol + 1);
      *pz = (char *)puVar2;
      iVar1 = sqlite3_column_bytes(*(sqlite3_stmt **)(pCtx + 0x38),iCol + 1);
      *pn = iVar1;
    }
  }
  else {
    *pz = (char *)0x0;
    *pn = 0;
  }
  return pCsr._4_4_;
}

Assistant:

static int fts5ApiColumnText(
  Fts5Context *pCtx, 
  int iCol, 
  const char **pz, 
  int *pn
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  if( fts5IsContentless((Fts5FullTable*)(pCsr->base.pVtab)) 
   || pCsr->ePlan==FTS5_PLAN_SPECIAL 
  ){
    *pz = 0;
    *pn = 0;
  }else{
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      *pz = (const char*)sqlite3_column_text(pCsr->pStmt, iCol+1);
      *pn = sqlite3_column_bytes(pCsr->pStmt, iCol+1);
    }
  }
  return rc;
}